

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttributeRecordSet.cpp
# Opt level: O1

void __thiscall KDIS::DATA_TYPE::AttributeRecordSet::ClearAttributeRecords(AttributeRecordSet *this)

{
  pointer pKVar1;
  pointer pKVar2;
  pointer pKVar3;
  
  pKVar1 = (this->m_vAttrRec).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pKVar2 = (this->m_vAttrRec).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pKVar3 = pKVar1;
  if (pKVar2 != pKVar1) {
    do {
      (**pKVar3->_vptr_KRef_Ptr)(pKVar3);
      pKVar3 = pKVar3 + 1;
    } while (pKVar3 != pKVar2);
    (this->m_vAttrRec).
    super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pKVar1;
  }
  this->m_ui16NumAttrRecs = 0;
  return;
}

Assistant:

void AttributeRecordSet::ClearAttributeRecords()
{
    m_vAttrRec.clear();
    m_ui16NumAttrRecs = 0;
}